

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_table_set_globalz(size_t len,secp256k1_ge *a,secp256k1_fe *zr)

{
  long in_RDX;
  ulong in_RDI;
  secp256k1_fe *unaff_retaddr;
  secp256k1_fe zs;
  size_t i;
  secp256k1_fe *in_stack_ffffffffffffffa8;
  secp256k1_ge *in_stack_ffffffffffffffb0;
  ulong local_20;
  
  for (local_20 = 0; local_20 < in_RDI; local_20 = local_20 + 1) {
    secp256k1_ge_verify(in_stack_ffffffffffffffb0);
    secp256k1_fe_verify(&in_stack_ffffffffffffffb0->x);
  }
  if (in_RDI != 0) {
    local_20 = in_RDI - 1;
    secp256k1_fe_normalize_weak((secp256k1_fe *)0x12341f);
    memcpy(&stack0xffffffffffffffb0,(void *)(in_RDX + local_20 * 0x30),0x30);
    while (local_20 != 0) {
      if (local_20 != in_RDI - 1) {
        secp256k1_fe_mul(&in_stack_ffffffffffffffb0->x,in_stack_ffffffffffffffa8,
                         (secp256k1_fe *)0x123472);
      }
      local_20 = local_20 + -1;
      secp256k1_ge_set_ge_zinv((secp256k1_ge *)zs.n[1],(secp256k1_ge *)zs.n[0],unaff_retaddr);
    }
  }
  for (local_20 = 0; local_20 < in_RDI; local_20 = local_20 + 1) {
    secp256k1_ge_verify(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

static void secp256k1_ge_table_set_globalz(size_t len, secp256k1_ge *a, const secp256k1_fe *zr) {
    size_t i;
    secp256k1_fe zs;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
        SECP256K1_FE_VERIFY(&zr[i]);
    }
#endif

    if (len > 0) {
        i = len - 1;
        /* Ensure all y values are in weak normal form for fast negation of points */
        secp256k1_fe_normalize_weak(&a[i].y);
        zs = zr[i];

        /* Work our way backwards, using the z-ratios to scale the x/y values. */
        while (i > 0) {
            if (i != len - 1) {
                secp256k1_fe_mul(&zs, &zs, &zr[i]);
            }
            i--;
            secp256k1_ge_set_ge_zinv(&a[i], &a[i], &zs);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&a[i]);
    }
#endif
}